

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall
AnalyserUnits_floorCeilingOperators_Test::TestBody(AnalyserUnits_floorCeilingOperators_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char cVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer __rhs_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ScopedTrace gtest_trace_514;
  AnalyserPtr analyser;
  ParserPtr parser;
  ModelPtr model;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  operators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  allocator_type local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  undefined1 local_108 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[6],_true>
            (&local_248,(char (*) [6])"floor",(char (*) [6])"floor");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (&local_208,(char (*) [8])"ceiling",(char (*) [5])"ceil");
  __l._M_len = 2;
  __l._M_array = &local_248;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_60,__l,(allocator_type *)&local_298);
  lVar5 = -0x80;
  paVar7 = &local_208.second.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                      (&paVar7->_M_allocated_capacity)[-4] + 1);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  local_f8 = local_60.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_250 = &local_208.second;
    __rhs_00 = local_60.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      libcellml::Parser::create(SUB81(local_108,0));
      std::operator+(&local_270,"analyser/units/",&__rhs_00->first);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_298 = &local_288;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_288._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_288._8_8_ = plVar2[3];
      }
      else {
        local_288._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar2;
      }
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      fileContents((string *)&local_248);
      libcellml::Parser::parseModel(local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.first._M_dataplus._M_p != &local_248.first.field_2) {
        operator_delete(local_248.first._M_dataplus._M_p,
                        local_248.first.field_2._M_allocated_capacity + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_270._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_248,"size_t(0)","parser->issueCount()",
                 (unsigned_long *)&local_298,(unsigned_long *)&local_270);
      if ((char)local_248.first._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_298);
        pcVar6 = "";
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pcVar6 = *(char **)(undefined1 *)local_248.first._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
                   ,0x1f5,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_298)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
        if (local_298 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') &&
             (local_298 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(local_298->_M_allocated_capacity + 8))();
          }
          local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_248.first._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      __rhs = &__rhs_00->second;
      std::operator+(&local_80,"The units in \'b = ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_270.field_2._M_allocated_capacity = *psVar3;
        local_270.field_2._8_8_ = plVar2[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar3;
        local_270._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_270._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_270,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_298 = &local_288;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_288._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_288._8_8_ = plVar2[3];
      }
      else {
        local_288._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar2;
      }
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_248.first._M_dataplus._M_p = (pointer)&local_248.first.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_248.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_248.first.field_2._8_8_ = plVar2[3];
      }
      else {
        local_248.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_248.first._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_248.first._M_string_length = plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_a0,"The units in \'c = ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_148 = &local_138;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_138 = *plVar4;
        lStack_130 = plVar2[3];
      }
      else {
        local_138 = *plVar4;
        local_148 = (long *)*plVar2;
      }
      local_140 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_128 = &local_118;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_118 = *plVar4;
        lStack_110 = plVar2[3];
      }
      else {
        local_118 = *plVar4;
        local_128 = (long *)*plVar2;
      }
      local_120 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_248.second._M_dataplus._M_p = (pointer)&local_248.second.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_248.second.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_248.second.field_2._8_8_ = plVar2[3];
      }
      else {
        local_248.second.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_248.second._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_248.second._M_string_length = plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_c0,"The units in \'d = ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_188 = &local_178;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_178 = *plVar4;
        lStack_170 = plVar2[3];
      }
      else {
        local_178 = *plVar4;
        local_188 = (long *)*plVar2;
      }
      local_180 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_188,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_168 = &local_158;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_158 = *plVar4;
        lStack_150 = plVar2[3];
      }
      else {
        local_158 = *plVar4;
        local_168 = (long *)*plVar2;
      }
      local_160 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
      local_208.first._M_dataplus._M_p = (pointer)&local_208.first.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_208.first.field_2._M_allocated_capacity = *psVar3;
        local_208.first.field_2._8_8_ = plVar2[3];
      }
      else {
        local_208.first.field_2._M_allocated_capacity = *psVar3;
        local_208.first._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_208.first._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_f0,"The units in \'e = ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_1c8 = &local_1b8;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_1b8 = *plVar4;
        lStack_1b0 = plVar2[3];
      }
      else {
        local_1b8 = *plVar4;
        local_1c8 = (long *)*plVar2;
      }
      local_1c0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c8,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_1a8 = &local_198;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_198 = *plVar4;
        lStack_190 = plVar2[3];
      }
      else {
        local_198 = *plVar4;
        local_1a8 = (long *)*plVar2;
      }
      local_1a0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      local_208.second._M_dataplus._M_p = (pointer)&local_208.second.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_208.second.field_2._M_allocated_capacity = *psVar3;
        local_208.second.field_2._8_8_ = plVar2[3];
      }
      else {
        local_208.second.field_2._M_allocated_capacity = *psVar3;
        local_208.second._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_208.second._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      __l_00._M_len = 4;
      __l_00._M_array = &local_248.first;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,__l_00,&local_271);
      lVar5 = -0x80;
      paVar7 = &local_208.second.field_2;
      do {
        if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar7->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                          paVar7->_M_allocated_capacity + 1);
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar7->_M_allocated_capacity + -4);
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,local_158 + 1);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      libcellml::Analyser::create();
      libcellml::Analyser::analyseModel((shared_ptr *)local_248.first._M_dataplus._M_p);
      testing::ScopedTrace::ScopedTrace
                ((ScopedTrace *)&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
                 ,0x202,"Issue occurred here.");
      local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248.first._M_dataplus._M_p;
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248.first._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_248.first._M_string_length + 8) =
               *(int *)(local_248.first._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_248.first._M_string_length + 8) =
               *(int *)(local_248.first._M_string_length + 8) + 1;
        }
      }
      expectEqualIssues((vector *)&local_48,(shared_ptr *)&local_298);
      if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_270);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248.first._M_string_length)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
      }
      if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
      }
      __rhs_00 = __rhs_00 + 1;
    } while (__rhs_00 != local_f8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

TEST(AnalyserUnits, floorCeilingOperators)
{
    std::vector<std::pair<std::string, std::string>> operators = {
        {"floor", "floor"},
        {"ceiling", "ceil"},
    };

    for (const auto &op : operators) {
        auto parser = libcellml::Parser::create();
        auto model = parser->parseModel(fileContents("analyser/units/" + op.first + ".cellml"));

        EXPECT_EQ(size_t(0), parser->issueCount());

        const std::vector<std::string> expectedIssues = {
            "The units in 'b = " + op.second + "(3.0)' in component 'main' are not equivalent. 'b' is 'dimensionless' while '" + op.second + "(3.0)' is in 'second'.",
            "The units in 'c = " + op.second + "(5.0)' in component 'main' are not equivalent. 'c' is 'dimensionless' while '" + op.second + "(5.0)' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
            "The units in 'd = " + op.second + "(7.0)' in component 'main' are not equivalent. 'd' is 'dimensionless' while '" + op.second + "(7.0)' is in 'frog'.",
            "The units in 'e = " + op.second + "(9.0)' in component 'main' are not equivalent. 'e' is 'dimensionless' while '" + op.second + "(9.0)' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        };

        auto analyser = libcellml::Analyser::create();

        analyser->analyseModel(model);

        EXPECT_EQ_ISSUES(expectedIssues, analyser);
    }
}